

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkerHelpers.hpp
# Opt level: O0

string * __thiscall
bredis::marker_helpers::stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>::
operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,
          array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this_00;
  bool bVar1;
  variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>
  *in_RCX;
  result_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  reference local_58;
  variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>
  *v;
  const_iterator __end0;
  const_iterator __begin0;
  recursive_array_t *__range3;
  allocator local_22;
  undefined1 local_21;
  array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *local_20;
  array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value_local;
  stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this_local;
  string *r;
  
  local_21 = 0;
  local_20 = value;
  value_local = (array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)
                this;
  this_local = (stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)
               __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[array] {",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  this_00 = local_20;
  __end0 = std::
           vector<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
           ::begin(&local_20->elements);
  v = (variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>
       *)std::
         vector<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>
         ::end(&this_00->elements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_*,_std::vector<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>_>
                                     *)&v), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_*,_std::vector<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>_>
               ::operator*(&__end0);
    boost::
    apply_visitor<bredis::marker_helpers::stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>,boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>>>const&>
              (&local_98,(boost *)this,
               (stringizer<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)
               local_58,in_RCX);
    std::operator+(&local_78,&local_98,", ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    __gnu_cxx::
    __normal_iterator<const_boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_*,_std::vector<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>,_std::allocator<boost::variant<bredis::markers::int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::string_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_bredis::markers::nil_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>,_boost::recursive_wrapper<bredis::markers::array_holder_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>_>_>_>_>_>
    ::operator++(&__end0);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string
    operator()(const markers::array_holder_t<Iterator> &value) const {
        std::string r = "[array] {";
        for (const auto &v : value.elements) {
            r += boost::apply_visitor(*this, v) + ", ";
        }
        r += "}";
        return r;
    }